

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O3

FT_Error FT_Done_Face(FT_Face face)

{
  int iVar1;
  FT_Driver driver;
  FT_Memory memory;
  FT_ListNode pFVar2;
  FT_ListNode pFVar3;
  FT_ListNode pFVar4;
  FT_ListNode pFVar5;
  FT_ListRec *pFVar6;
  
  if ((face != (FT_Face)0x0) && (driver = face->driver, driver != (FT_Driver)0x0)) {
    iVar1 = face->internal->refcount;
    face->internal->refcount = iVar1 + -1;
    if (1 < iVar1) {
      return 0;
    }
    pFVar5 = (driver->faces_list).head;
    if (pFVar5 != (FT_ListNode)0x0) {
      memory = (driver->root).memory;
      do {
        if ((FT_Face)pFVar5->data == face) {
          pFVar2 = pFVar5->prev;
          pFVar3 = pFVar5->next;
          pFVar6 = (FT_ListRec *)&pFVar2->next;
          if (pFVar2 == (FT_ListNode)0x0) {
            pFVar6 = &driver->faces_list;
          }
          pFVar6->head = pFVar3;
          pFVar4 = (FT_ListNode)&(driver->faces_list).tail;
          if (pFVar3 != (FT_ListNode)0x0) {
            pFVar4 = pFVar3;
          }
          pFVar4->prev = pFVar2;
          (*memory->free)(memory,pFVar5);
          destroy_face(memory,face,driver);
          return 0;
        }
        pFVar5 = pFVar5->next;
      } while (pFVar5 != (FT_ListNode)0x0);
    }
  }
  return 0x23;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Done_Face( FT_Face  face )
  {
    FT_Error     error;
    FT_Driver    driver;
    FT_Memory    memory;
    FT_ListNode  node;


    error = FT_ERR( Invalid_Face_Handle );
    if ( face && face->driver )
    {
      face->internal->refcount--;
      if ( face->internal->refcount > 0 )
        error = FT_Err_Ok;
      else
      {
        driver = face->driver;
        memory = driver->root.memory;

        /* find face in driver's list */
        node = FT_List_Find( &driver->faces_list, face );
        if ( node )
        {
          /* remove face object from the driver's list */
          FT_List_Remove( &driver->faces_list, node );
          FT_FREE( node );

          /* now destroy the object proper */
          destroy_face( memory, face, driver );
          error = FT_Err_Ok;
        }
      }
    }

    return error;
  }